

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

void INT_CMregister_handler(CMFormat format,CMHandlerFunc handler,void *client_data)

{
  CManager p_Var1;
  CMincoming_format_list p_Var2;
  CMHandlerFunc p_Var3;
  int iVar4;
  undefined8 uVar5;
  char *__s1;
  long lVar6;
  long lVar7;
  
  p_Var1 = format->cm;
  format->handler = handler;
  format->client_data = client_data;
  if (0 < p_Var1->in_format_count) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      uVar5 = FMFormat_of_original(*(undefined8 *)((long)&p_Var1->in_formats->format + lVar7));
      __s1 = (char *)name_of_FMformat(uVar5);
      iVar4 = strcmp(__s1,format->format_name);
      if (iVar4 == 0) {
        if (format->registration_pending != 0) {
          CMcomplete_format_registration(format,1);
        }
        p_Var2 = p_Var1->in_formats;
        if (*(FFSTypeHandle *)((long)&p_Var2->format + lVar7) == format->ffsformat) {
          p_Var3 = *(CMHandlerFunc *)((long)&p_Var2->handler + lVar7);
          if (p_Var3 == (CMHandlerFunc)0x0) {
            *(CMHandlerFunc *)((long)&p_Var2->handler + lVar7) = handler;
            *(void **)((long)&p_Var2->client_data + lVar7) = client_data;
          }
          else if ((p_Var3 != handler) ||
                  (*(void **)((long)&p_Var2->client_data + lVar7) != client_data)) {
            INT_CMregister_handler_cold_1();
          }
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x48;
    } while (lVar6 < p_Var1->in_format_count);
  }
  return;
}

Assistant:

void
INT_CMregister_handler(CMFormat format, CMHandlerFunc handler,
		       void *client_data)
{
    CManager cm = format->cm;
    int i;
    format->handler = handler;
    format->client_data = client_data;

    for (i=0; i< cm->in_format_count; i++) {
	if (strcmp(name_of_FMformat(FMFormat_of_original(cm->in_formats[i].format)), format->format_name) == 0) {
	    if (format->registration_pending) {
	        CMcomplete_format_registration(format, 1);
	    }
	    if (cm->in_formats[i].format == format->ffsformat) {
	        if (!cm->in_formats[i].handler) {
		    cm->in_formats[i].handler = handler;
		    cm->in_formats[i].client_data = client_data;
		} else if ((cm->in_formats[i].handler != handler) ||
			   (cm->in_formats[i].client_data != client_data)) {
		    fprintf(stderr, "Warning, CMregister_handler() called multiple times for the same format with different handler or client_data\n");
		    fprintf(stderr, "Repeated calls will be ignored\n");
		}
	    }
	}
    }
}